

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::getInfoValue(Highs *this,string *info,double *value)

{
  InfoStatus IVar1;
  InfoStatus status;
  double *in_stack_00000098;
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *in_stack_000000a0;
  bool in_stack_000000af;
  string *in_stack_000000b0;
  HighsLogOptions *in_stack_000000b8;
  undefined4 local_4;
  
  IVar1 = getLocalInfoValue(in_stack_000000b8,in_stack_000000b0,in_stack_000000af,in_stack_000000a0,
                            in_stack_00000098);
  if (IVar1 == kOk) {
    local_4 = kOk;
  }
  else if (IVar1 == kUnavailable) {
    local_4 = kWarning;
  }
  else {
    local_4 = kError;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getInfoValue(const std::string& info, double& value) const {
  InfoStatus status = getLocalInfoValue(options_.log_options, info, info_.valid,
                                        info_.records, value);
  if (status == InfoStatus::kOk) {
    return HighsStatus::kOk;
  } else if (status == InfoStatus::kUnavailable) {
    return HighsStatus::kWarning;
  } else {
    return HighsStatus::kError;
  }
}